

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool testPty(StringRef *cmdLine)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> HVar5;
  C *__file;
  ulong uVar6;
  ssize_t sVar7;
  int __oflag;
  File slavePty;
  Pty masterPty;
  Pipe execPipe;
  Error error;
  fd_set rdset;
  winsize winSize;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_218;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_214;
  Pipe local_210;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_208;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_1e8;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_1c8;
  ulong local_1a8 [16];
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_128 [8];
  
  puts("Opening master PTY...");
  local_214.m_h = -1;
  local_218.m_h = -1;
  local_210.m_readFile.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_210.m_writeFile.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  iVar3 = axl::io::psx::Pty::open((Pty *)&local_214,(char *)0x2,__oflag);
  if ((char)iVar3 == '\0') goto LAB_00114b20;
  iVar3 = grantpt(local_214.m_h);
  if (iVar3 == 0) {
    iVar3 = unlockpt(local_214.m_h);
    if (iVar3 != 0) goto LAB_00114b1b;
    bVar2 = axl::io::psx::File::setBlockingMode((File *)&local_214,false);
    if (bVar2) {
      axl::io::psx::Pty::getSlaveFileName((String *)local_128,(Pty *)&local_214);
      if (local_218.m_h != -1) {
        close(local_218.m_h);
        local_218.m_h = -1;
      }
      if (local_128[0].m_length == 0) {
        __file = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      else {
        __file = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::
                 ensureNullTerminated(local_128);
      }
      local_218.m_h = open(__file,0x42,0x1b6);
      if (local_218.m_h == -1) {
        axl::err::setLastSystemError();
        bVar2 = false;
      }
      else {
        bVar2 = axl::io::psx::Pipe::create(&local_210);
      }
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(local_128);
      if (bVar2 != false) {
        iVar3 = fcntl((int)local_210.m_writeFile.
                           super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,2
                      ,1);
        if (iVar3 == -1) {
          axl::err::setLastSystemError();
        }
        local_1e8.m_p = (ErrorHdr *)0x0;
        local_1e8.m_hdr = (BufHdr *)0x0;
        local_1e8.m_size = 0;
        _Var4 = fork();
        if (_Var4 == -1) {
          axl::err::setLastSystemError();
LAB_00114d4e:
          bVar2 = false;
        }
        else {
          if (_Var4 == 0) {
            setsid();
            iVar3 = ioctl(local_218.m_h,0x540e,0);
            if (iVar3 == -1) {
              axl::err::setLastSystemError();
            }
            dup2(local_218.m_h,0);
            dup2(local_218.m_h,1);
            dup2(local_218.m_h,2);
            if (local_218.m_h != -1) {
              close(local_218.m_h);
              local_218.m_h = -1;
            }
            exec(cmdLine);
            axl::err::getLastError();
            axl::rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::move
                      ((Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef> *)
                       &local_1e8,(ErrorRef *)local_128);
            axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release
                      ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)local_128);
            sVar7 = write((int)local_210.m_writeFile.
                               super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                               m_h,local_1e8.m_p,(ulong)(local_1e8.m_p)->m_size);
            if (sVar7 == -1) {
              axl::err::setLastSystemError();
            }
            iVar3 = fsync((int)local_210.m_writeFile.
                               super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                               m_h);
            if (iVar3 == -1) {
              axl::err::setLastSystemError();
            }
            _exit(-1);
          }
          if (local_210.m_writeFile.
              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h != -1) {
            close((int)local_210.m_writeFile.
                       super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h);
            local_210.m_writeFile.
            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
                 (Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
          }
          if (local_218.m_h != -1) {
            close(local_218.m_h);
            local_218.m_h = -1;
          }
          local_1a8[0xe] = 0;
          local_1a8[0xf] = 0;
          local_1a8[0xc] = 0;
          local_1a8[0xd] = 0;
          local_1a8[10] = 0;
          local_1a8[0xb] = 0;
          local_1a8[8] = 0;
          local_1a8[9] = 0;
          local_1a8[6] = 0;
          local_1a8[7] = 0;
          local_1a8[4] = 0;
          local_1a8[5] = 0;
          local_1a8[2] = 0;
          local_1a8[3] = 0;
          local_1a8[0] = 0;
          local_1a8[1] = 0;
          HVar5.m_h = (int)local_210.m_readFile.
                           super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h +
                      0x3f;
          if (-1 < (int)local_210.m_readFile.
                        super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h) {
            HVar5 = local_210.m_readFile.
                    super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h;
          }
          local_1a8[HVar5.m_h >> 6] =
               local_1a8[HVar5.m_h >> 6] |
               1L << ((byte)local_210.m_readFile.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h
                     & 0x3f);
          uVar6 = read((int)local_210.m_readFile.
                            super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                       local_128,0x100);
          uVar1 = (uint)local_128[0].m_p;
          if (uVar6 != 0) {
            if (uVar6 != 0xffffffffffffffff) {
              if (uVar6 == (uint)local_128[0].m_p) {
                local_208.m_p = (ErrorHdr *)0x0;
                local_208.m_hdr = (BufHdr *)0x0;
                local_208.m_size = 0;
                axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::attachBufHdr
                          (&local_208,(BufHdr *)0x0);
                local_208.m_size = 0x18;
                if (0x18 < uVar1) {
                  local_208.m_size = (size_t)uVar1;
                }
                local_208.m_p = (ErrorHdr *)local_128;
                axl::err::setError((ErrorRef *)&local_208);
                axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_208);
              }
              else {
                axl::err::Error::Error((Error *)&local_208,"POSIX execvpe failed");
                local_1c8.m_p = (ErrorHdr *)0x0;
                local_1c8.m_hdr = (BufHdr *)0x0;
                local_1c8.m_size = 0;
                axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move
                          (&local_1c8,&local_208);
                axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_208);
                axl::err::setError((ErrorRef *)&local_1c8);
                axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_1c8);
              }
              goto LAB_00114d4e;
            }
            axl::err::setLastSystemError();
          }
          local_1a8[0] = local_1a8[0] & 0xffffffff00000000;
          axl::io::psx::File::setBlockingMode((File *)local_1a8,false);
          local_128[0].m_p._0_4_ = 0x5a0028;
          iVar3 = ioctl(local_214.m_h,0x5414);
          if (iVar3 == -1) {
            axl::err::setLastSystemError();
          }
          pumpChildStdio(local_214.m_h,local_214.m_h,-1);
          axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
                    ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)local_1a8);
          bVar2 = true;
        }
        axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_1e8);
        goto LAB_00114b22;
      }
    }
  }
  else {
LAB_00114b1b:
    axl::err::setLastSystemError();
  }
LAB_00114b20:
  bVar2 = false;
LAB_00114b22:
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            (&local_210.m_writeFile.
              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_210);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle(&local_218);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle(&local_214);
  return bVar2;
}

Assistant:

bool
testPty(const sl::StringRef& cmdLine) {
	printf("Opening master PTY...\n");

	axl::io::psx::Pty masterPty;
	axl::io::psx::File slavePty;
	axl::io::psx::Pipe execPipe;

	bool result =
		masterPty.open() &&
		masterPty.grant() &&
		masterPty.unlock() &&
		masterPty.setBlockingMode(false) &&
		slavePty.open(masterPty.getSlaveFileName()) &&
		execPipe.create();

	if (!result)
		return false;

	execPipe.m_writeFile.fcntl(F_SETFD, FD_CLOEXEC);
	err::Error error;

	pid_t pid = ::fork();
	switch (pid) {
	case -1:
		err::setLastSystemError();
		return false;

	case 0:
		::setsid();

		slavePty.ioctl(TIOCSCTTY, (int)0);

		::dup2(slavePty, STDIN_FILENO);
		::dup2(slavePty, STDOUT_FILENO);
		::dup2(slavePty, STDERR_FILENO);

		slavePty.close();

		exec(cmdLine);

		error = err::getLastError();
		execPipe.m_writeFile.write(error, error->m_size);
		execPipe.m_writeFile.flush();

		::_exit(-1);
		ASSERT(false);

	default:
		execPipe.m_writeFile.close();
		slavePty.close();

		fd_set rdset;
		FD_ZERO(&rdset);
		FD_SET(execPipe.m_readFile, &rdset);

		char buffer[256];
		size_t size = execPipe.m_readFile.read(buffer, sizeof(buffer));
		if (size == 0 || size == -1)
			break;

		if (((err::ErrorHdr*)buffer)->m_size == size)
			err::setError((err::ErrorHdr*)buffer);
		else
			err::setError("POSIX execvpe failed"); // unlikely fallback

		return false;
	}

	axl::io::psx::File stdinFile;
	stdinFile.attach(STDIN_FILENO);
	stdinFile.setBlockingMode(false);

	struct winsize winSize;
	winSize.ws_col = 90;
	winSize.ws_row = 40;
	masterPty.ioctl(TIOCSWINSZ, &winSize);

	pumpChildStdio(masterPty, masterPty, -1);
	return true;
}